

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O0

int dividebyN(int N)

{
  int local_10;
  uint local_c;
  int N_local;
  
  for (local_10 = N; local_10 % 0x35 == 0; local_10 = local_10 / 0x35) {
  }
  for (; local_10 % 0x2f == 0; local_10 = local_10 / 0x2f) {
  }
  for (; local_10 % 0x2b == 0; local_10 = local_10 / 0x2b) {
  }
  for (; local_10 % 0x29 == 0; local_10 = local_10 / 0x29) {
  }
  for (; local_10 % 0x25 == 0; local_10 = local_10 / 0x25) {
  }
  for (; local_10 % 0x1f == 0; local_10 = local_10 / 0x1f) {
  }
  for (; local_10 % 0x1d == 0; local_10 = local_10 / 0x1d) {
  }
  for (; local_10 % 0x17 == 0; local_10 = local_10 / 0x17) {
  }
  for (; local_10 % 0x11 == 0; local_10 = local_10 / 0x11) {
  }
  for (; local_10 % 0xd == 0; local_10 = local_10 / 0xd) {
  }
  for (; local_10 % 0xb == 0; local_10 = local_10 / 0xb) {
  }
  for (; local_10 % 8 == 0; local_10 = local_10 / 8) {
  }
  for (; local_10 % 7 == 0; local_10 = local_10 / 7) {
  }
  for (; local_10 % 5 == 0; local_10 = local_10 / 5) {
  }
  for (; local_10 % 4 == 0; local_10 = local_10 / 4) {
  }
  for (; local_10 % 3 == 0; local_10 = local_10 / 3) {
  }
  for (; local_10 % 2 == 0; local_10 = local_10 / 2) {
  }
  local_c = (uint)(local_10 == 1);
  return local_c;
}

Assistant:

int dividebyN(int N) {
	while (N%53 == 0) {
		N = N/53;
	}
	while (N%47 == 0) {
		N = N/47;
	}
	while (N%43 == 0) {
		N = N/43;
	}
	while (N%41 == 0) {
		N = N/41;
	}
	while (N%37 == 0) {
		N = N/37;
	}
	while (N%31 == 0) {
		N = N/31;
	}
	while (N%29 == 0) {
		N = N/29;
	}
	while (N%23 == 0) {
		N = N/23;
	}
	while (N%17 == 0) {
		N = N/17;
	}
	while (N%13 == 0) {
		N = N/13;
	}
	while (N%11 == 0) {
		N = N/11;
	}
	while (N%8 == 0) {
		N = N/8;
	}
	while (N%7 == 0) {
		N = N/7;
	}
	while (N%5 == 0) {
		N = N/5;
	}
	while (N%4 == 0) {
		N = N/4;
	}
	while (N%3 == 0) {
		N = N/3;
	}
	while (N%2 == 0) {
		N = N/2;
	}
	if (N == 1) {
		return 1;
	}
	 return 0;

}